

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BilateralNormalFilteringForMeshDenoising.cpp
# Opt level: O0

double __thiscall
BilateralNormalFilteringForMeshDenoising::getSigmaC
          (BilateralNormalFilteringForMeshDenoising *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *face_centroid,double multiple_sigma_c)

{
  bool bVar1;
  int iVar2;
  BaseHandle *pBVar3;
  reference pvVar4;
  reference pvVar5;
  double dVar6;
  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
  local_d8;
  vector_type local_c0;
  undefined1 local_a8 [8];
  Point cj;
  undefined1 local_88 [8];
  FaceFaceIter ff_it;
  Point ci;
  undefined1 local_48 [8];
  FaceIter f_it;
  double num;
  double sigma_c;
  double multiple_sigma_c_local;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  *face_centroid_local;
  TriMesh *mesh_local;
  BilateralNormalFilteringForMeshDenoising *this_local;
  
  num = 0.0;
  f_it.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
  f_it.skip_bits_ = 0;
  _local_48 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
  while( true ) {
    join_0x00000010_0x00000000_ = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
    bVar1 = OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
            ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)local_48,
                         (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)(ci.super_VectorDataT<double,_3>.values_ + 2));
    if (!bVar1) break;
    pBVar3 = &OpenMesh::Iterators::
              GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
              ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                            *)local_48)->super_BaseHandle;
    iVar2 = OpenMesh::BaseHandle::idx(pBVar3);
    pvVar4 = std::
             vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
             operator[](face_centroid,(long)iVar2);
    ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ =
         (pvVar4->super_VectorDataT<double,_3>).values_[0];
    ci.super_VectorDataT<double,_3>.values_[0] = (pvVar4->super_VectorDataT<double,_3>).values_[1];
    ci.super_VectorDataT<double,_3>.values_[1] = (pvVar4->super_VectorDataT<double,_3>).values_[2];
    pvVar5 = OpenMesh::Iterators::
             GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
             ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)local_48);
    cj.super_VectorDataT<double,_3>.values_[2]._4_4_ = (pvVar5->super_BaseHandle).idx_;
    OpenMesh::PolyConnectivity::ff_iter
              ((FaceFaceIter *)local_88,(PolyConnectivity *)mesh,
               (FaceHandle)cj.super_VectorDataT<double,_3>.values_[2]._4_4_);
    while( true ) {
      bVar1 = OpenMesh::Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
              ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                          *)local_88);
      if (!bVar1) break;
      pBVar3 = &OpenMesh::Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                ::operator->((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                              *)local_88)->super_BaseHandle;
      iVar2 = OpenMesh::BaseHandle::idx(pBVar3);
      pvVar4 = std::
               vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
               ::operator[](face_centroid,(long)iVar2);
      local_a8 = (undefined1  [8])(pvVar4->super_VectorDataT<double,_3>).values_[0];
      cj.super_VectorDataT<double,_3>.values_[0] = (pvVar4->super_VectorDataT<double,_3>).values_[1]
      ;
      cj.super_VectorDataT<double,_3>.values_[1] = (pvVar4->super_VectorDataT<double,_3>).values_[2]
      ;
      OpenMesh::VectorT<double,_3>::operator-
                (&local_c0,
                 (VectorT<double,_3> *)
                 &ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_,
                 (vector_type *)local_a8);
      dVar6 = OpenMesh::VectorT<double,_3>::length(&local_c0);
      num = dVar6 + num;
      f_it._8_8_ = (double)f_it._8_8_ + 1.0;
      OpenMesh::Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
      ::operator++(&local_d8,
                   (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                    *)local_88,0);
    }
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)local_48,0);
  }
  return (multiple_sigma_c / (double)f_it._8_8_) * num;
}

Assistant:

double BilateralNormalFilteringForMeshDenoising::getSigmaC(TriMesh &mesh, std::vector<TriMesh::Point> &face_centroid, double multiple_sigma_c)
{
    double sigma_c = 0.0;
    double num = 0.0;
    for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
    {
        TriMesh::Point ci = face_centroid[f_it->idx()];
        for(TriMesh::FaceFaceIter ff_it = mesh.ff_iter(*f_it); ff_it.is_valid(); ff_it++)
        {
            TriMesh::Point cj = face_centroid[ff_it->idx()];
            sigma_c += (ci - cj).length();
            num++;
        }
    }
    sigma_c *= multiple_sigma_c / num;

    return sigma_c;
}